

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMoves.cpp
# Opt level: O2

void runTestMoves(vector<int,_std::allocator<int>_> *moves,
                 vector<unsigned_int,_std::allocator<unsigned_int>_> *expectedValues,
                 BoardSize boardSize)

{
  int *piVar1;
  pointer puVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar3;
  long lVar4;
  char *message;
  long lVar5;
  ulong uVar6;
  int *piVar7;
  __single_object board;
  AssertHelper local_58;
  Message local_50;
  AssertionResult gtest_ar;
  BoardSize boardSize_local;
  
  gtest_ar.success_ = false;
  gtest_ar._1_3_ = 0;
  boardSize_local = boardSize;
  std::make_unique<Board,BoardSize&,BoardMode>((BoardSize *)&board,&boardSize_local);
  piVar1 = (moves->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  for (piVar7 = (moves->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start; piVar7 != piVar1; piVar7 = piVar7 + 1) {
    Board::checkMove((Board *)board._M_t.super___uniq_ptr_impl<Board,_std::default_delete<Board>_>.
                              _M_t.super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.
                              super__Head_base<0UL,_Board_*,_false>._M_head_impl,
                     (long)(*piVar7 / 10),(long)(*piVar7 % 10));
  }
  pvVar3 = Board::getBoardValues
                     ((Board *)board._M_t.super___uniq_ptr_impl<Board,_std::default_delete<Board>_>.
                               _M_t.super__Tuple_impl<0UL,_Board_*,_std::default_delete<Board>_>.
                               super__Head_base<0UL,_Board_*,_false>._M_head_impl);
  lVar4 = 0;
  lVar5 = 0;
  uVar6 = 0;
  do {
    puVar2 = (pvVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(pvVar3->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3) <= uVar6) {
LAB_0011136c:
      std::unique_ptr<Board,_std::default_delete<Board>_>::~unique_ptr(&board);
      return;
    }
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
              ((internal *)&gtest_ar,"values[i]","expectedValues[i]",
               (unsigned_long *)((long)puVar2 + lVar5),
               (uint *)((long)(expectedValues->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar4));
    if (gtest_ar.success_ == false) {
      testing::Message::Message(&local_50);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        message = "";
      }
      else {
        message = *(char **)gtest_ar.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_58,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Przemyslawmd[P]Fifteen/tests/TestMoves.cpp"
                 ,0x19,message);
      testing::internal::AssertHelper::operator=(&local_58,&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_58);
      if (local_50.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
          (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)local_50.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
      goto LAB_0011136c;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 8;
    lVar4 = lVar4 + 4;
  } while( true );
}

Assistant:

void runTestMoves(const std::vector<int>& moves, const std::vector<uint>& expectedValues, BoardSize boardSize)
{
    auto board = std::make_unique<Board>(boardSize, BoardMode::NUMERIC);
    for (int move : moves)
    {
        board->checkMove(move / 10, move % 10);
    }
    
    const auto& values = board->getBoardValues();
    for (int i = 0; i < values.size(); ++i)
    {
        ASSERT_EQ(values[i], expectedValues[i]);
    }
}